

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.cc
# Opt level: O1

void __thiscall LongReadsDatastore::load_index(LongReadsDatastore *this,string *file)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  runtime_error *prVar5;
  SDG_FILETYPE type;
  sdgVersion_t version;
  sdgMagic_t magic;
  uint64_t count;
  uint64_t fPos;
  uint64_t nReads;
  ifstream input_file;
  ushort local_27e;
  ushort local_27c;
  short local_27a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  undefined8 local_238;
  undefined8 local_230;
  long local_228 [4];
  byte abStack_208 [488];
  
  std::__cxx11::string::_M_assign((string *)&this->filename);
  iVar1 = open((this->filename)._M_dataplus._M_p,0);
  this->fd = iVar1;
  std::ifstream::ifstream(local_228,(string *)file,_S_bin);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed to open ",0xf);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(file->_M_dataplus)._M_p,file->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_278,"Could not open ",file);
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_230 = 0;
  std::istream::read((char *)local_228,(long)&local_27a);
  std::istream::read((char *)local_228,(long)&local_27c);
  std::istream::read((char *)local_228,(long)&local_27e);
  if (local_27a != 0x5d6) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_278,"This file appears to be corrupted: ",file);
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_27c < 3) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_258,(uint)local_27c);
    std::operator+(&local_278,"Incompatible version",&local_258);
    std::runtime_error::runtime_error(prVar5,(string *)&local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_27e == 4) {
    std::istream::read((char *)local_228,(long)&local_230);
    std::istream::read((char *)local_228,(long)&local_238);
    std::istream::read((char *)local_228,(long)&local_278);
    std::__cxx11::string::resize((ulong)&this->name,(char)local_278._M_dataplus._M_p);
    std::istream::read((char *)local_228,(long)(this->name)._M_dataplus._M_p);
    std::istream::seekg(local_228,local_238,0);
    std::istream::read((char *)local_228,(long)&local_278);
    std::vector<ReadPosSize,_std::allocator<ReadPosSize>_>::resize
              (&this->read_to_fileRecord,(size_type)local_278._M_dataplus._M_p);
    if (local_278._M_dataplus._M_p != (pointer)0x0) {
      std::istream::read((char *)local_228,
                         (long)(this->read_to_fileRecord).
                               super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl
                               .super__Vector_impl_data._M_start);
    }
    poVar2 = sdglib::OutputLog(INFO,true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"LongReadsDatastore open: ",0x19);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(this->filename)._M_dataplus._M_p,(this->filename)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," Total reads: ",0xe);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::ifstream::~ifstream(local_228);
    return;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_258,(uint)local_27e);
  std::operator+(&local_278,"Incompatible file type",&local_258);
  std::runtime_error::runtime_error(prVar5,(string *)&local_278);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LongReadsDatastore::load_index(std::string &file) {
    filename = file;
    fd = open(filename.data(), O_RDONLY);
    std::ifstream input_file(file, std::ios_base::binary);
    if (!input_file) {
        std::cerr << "Failed to open " << file <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + file);
    }
    uint64_t nReads(0);
    uint64_t fPos;

    sdgMagic_t magic;
    sdgVersion_t version;
    SDG_FILETYPE type;
    input_file.read((char *) &magic, sizeof(magic));
    input_file.read((char *) &version, sizeof(version));
    input_file.read((char *) &type, sizeof(type));
    if (magic != SDG_MAGIC) {
        throw std::runtime_error("This file appears to be corrupted: " + file);
    }

    if (version < min_compat) {
        throw std::runtime_error("Incompatible version" + std::to_string(version));
    }

    if (type != LongDS_FT) {
        throw std::runtime_error("Incompatible file type" + std::to_string(type));
    }

    input_file.read((char*)&nReads, sizeof(nReads));

    input_file.read((char*)&fPos, sizeof(fPos));

    sdglib::read_string(input_file, name);

    input_file.seekg(fPos);
    sdglib::read_flat_vector(input_file, read_to_fileRecord);

    sdglib::OutputLog()<<"LongReadsDatastore open: "<<filename<<" Total reads: " <<size()<<std::endl;
}